

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

bool TestConstExpr::NotEqualTest<unsigned_long,long>(void)

{
  int local_44 [5];
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_30;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_28;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_20;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_18;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_10;
  
  local_44[4] = 3;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<int>(&local_10,local_44 + 4);
  if (local_10.m_int != 2) {
    local_44[3] = 4;
    SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt<int>(&local_18,local_44 + 3);
    if (local_18.m_int != 5) {
      local_44[2] = 6;
      SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
      ::SafeInt<int>(&local_20,local_44 + 2);
      if (local_20.m_int != 7) {
        local_44[1] = 1;
        SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
        ::SafeInt<int>(&local_28,local_44 + 1);
        if (local_28.m_int == 0) {
          local_44[0] = 0;
          SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
          ::SafeInt<int>(&local_30,local_44);
          return local_30.m_int != 0;
        }
      }
    }
  }
  return false;
}

Assistant:

SAFEINT_CONSTEXPR11 bool NotEqualTest()
	{
		return
			(U)2 != SafeInt<T>(3) &&
			SafeInt<T>(4) != (U)5 &&
			SafeInt<T>(6) != SafeInt<U>(7) &&
			true != SafeInt<T>(1) &&
			false != SafeInt<T>(0);
	}